

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

int __thiscall QFSFileEngine::copy(QFSFileEngine *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  byte bVar1;
  byte bVar2;
  QFSFileEnginePrivate *pQVar3;
  long in_FS_OFFSET;
  bool ret;
  QFSFileEnginePrivate *d;
  QSystemError error;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  FileError error_00;
  undefined6 in_stack_ffffffffffffff80;
  QSystemError local_48 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QFSFileEngine *)0x136665);
  local_48[0].errorCode = -0x55555556;
  local_48[0].errorScope = 0xaaaaaaaa;
  QSystemError::QSystemError(local_48);
  error_00 = (FileError)((ulong)&pQVar3->fileEntry >> 0x20);
  QFileSystemEntry::QFileSystemEntry
            ((QFileSystemEntry *)this,
             (QString *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  bVar1 = QFileSystemEngine::copyFile
                    ((QFileSystemEntry *)this,
                     (QFileSystemEntry *)
                     CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                     (QSystemError *)0x1366b1);
  QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)this);
  bVar2 = bVar1 & 1;
  if (bVar2 == 0) {
    QSystemError::toString
              ((QSystemError *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    QAbstractFileEngine::setError
              ((QAbstractFileEngine *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffff80)),
               error_00,(QString *)this);
    QString::~QString((QString *)0x1366fd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),bVar2) & 0xffffff01;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::copy(const QString &copyName)
{
    Q_D(QFSFileEngine);
    QSystemError error;
    bool ret = QFileSystemEngine::copyFile(d->fileEntry, QFileSystemEntry(copyName), error);
    if (!ret)
        setError(QFile::CopyError, error.toString());
    return ret;
}